

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmTargetTraceDependencies::Trace(cmTargetTraceDependencies *this)

{
  _Elt_pointer ppcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  string *psVar5;
  cmCustomCommand *cc;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objDeps;
  allocator local_71;
  cmSourceFile *local_70;
  string *local_68;
  string *psStack_60;
  undefined8 local_58;
  string local_50;
  
  while (ppcVar1 = (this->SourceQueue).c.
                   super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur,
        (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur != ppcVar1) {
    local_70 = *ppcVar1;
    std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::pop_front(&(this->SourceQueue).c);
    pmVar3 = std::
             map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
             ::operator[](&this->GeneratorTarget->SourceDepends,&local_70);
    this_00 = local_70;
    this->CurrentEntry = pmVar3;
    std::__cxx11::string::string((string *)&local_50,"OBJECT_DEPENDS",(allocator *)&local_68);
    pcVar4 = cmSourceFile::GetProperty(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pcVar4 != (char *)0x0) {
      local_68 = (string *)0x0;
      psStack_60 = (string *)0x0;
      local_58 = 0;
      std::__cxx11::string::string((string *)&local_50,pcVar4,&local_71);
      cmSystemTools::ExpandListArgument
                (&local_50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68,false);
      std::__cxx11::string::~string((string *)&local_50);
      for (psVar5 = local_68; psVar5 != psStack_60; psVar5 = psVar5 + 1) {
        bVar2 = cmsys::SystemTools::FileIsFullPath(psVar5);
        if (bVar2) {
          cmsys::SystemTools::CollapseFullPath(&local_50,psVar5);
          std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      FollowNames(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
    }
    psVar5 = cmSourceFile::GetFullPath(local_70,(string *)0x0);
    FollowName(this,psVar5);
    FollowNames(this,&local_70->Depends);
    cc = cmSourceFile::GetCustomCommand(local_70);
    if (cc != (cmCustomCommand *)0x0) {
      CheckCustomCommand(this,cc);
    }
  }
  this->CurrentEntry = (SourceEntry *)0x0;
  cmGeneratorTarget::AddTracedSources(this->GeneratorTarget,&this->NewSources);
  return;
}

Assistant:

void cmTargetTraceDependencies::Trace()
{
  // Process one dependency at a time until the queue is empty.
  while(!this->SourceQueue.empty())
    {
    // Get the next source from the queue.
    cmSourceFile* sf = this->SourceQueue.front();
    this->SourceQueue.pop();
    this->CurrentEntry = &this->GeneratorTarget->SourceDepends[sf];

    // Queue dependencies added explicitly by the user.
    if(const char* additionalDeps = sf->GetProperty("OBJECT_DEPENDS"))
      {
      std::vector<std::string> objDeps;
      cmSystemTools::ExpandListArgument(additionalDeps, objDeps);
      for(std::vector<std::string>::iterator odi = objDeps.begin();
          odi != objDeps.end(); ++odi)
        {
        if (cmSystemTools::FileIsFullPath(*odi))
          {
          *odi = cmSystemTools::CollapseFullPath(*odi);
          }
        }
      this->FollowNames(objDeps);
      }

    // Queue the source needed to generate this file, if any.
    this->FollowName(sf->GetFullPath());

    // Queue dependencies added programatically by commands.
    this->FollowNames(sf->GetDepends());

    // Queue custom command dependencies.
    if(cmCustomCommand const* cc = sf->GetCustomCommand())
      {
      this->CheckCustomCommand(*cc);
      }
    }
  this->CurrentEntry = 0;

  this->GeneratorTarget->AddTracedSources(this->NewSources);
}